

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O1

void __thiscall
cp::cpgen::calcNextFootprint
          (cpgen *this,Vector3 *step_vector,double step_angle,Pose *ref_waist_pose,
          Pose *ref_land_pose)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  type rhs;
  ActualDstType actualDst;
  double dVar4;
  double dVar5;
  double dVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  Packet2d b_zw;
  double dVar22;
  undefined1 auVar21 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  
  dVar4 = cos(step_angle * 0.5);
  dVar5 = sin(step_angle * 0.5);
  auVar2 = _DAT_0010a060;
  dVar9 = dVar5 * 0.0;
  dVar18 = dVar5 * 0.0;
  dVar22 = dVar4 * 0.0;
  dVar10 = dVar9 * 0.0;
  auVar16._8_4_ = SUB84(dVar10 - dVar18,0);
  auVar16._0_8_ = dVar10 - dVar22;
  auVar16._12_4_ = (int)((ulong)(dVar10 - dVar18) >> 0x20);
  auVar8 = ZEXT816(0x8000000000000000);
  dVar15 = SUB168(auVar16 ^ auVar8,0) + dVar9 + dVar18;
  dVar17 = SUB168(auVar16 ^ auVar8,8) + dVar9 + dVar22;
  auVar21._8_4_ = SUB84(dVar10 + dVar18,0);
  auVar21._0_8_ = dVar10 + dVar22;
  auVar21._12_4_ = (int)((ulong)(dVar10 + dVar18) >> 0x20);
  dVar19 = SUB168(auVar21 ^ _DAT_0010a060,0) + (dVar5 - dVar10);
  dVar23 = SUB168(auVar21 ^ _DAT_0010a060,8) + (dVar4 - dVar10);
  dVar4 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[0];
  dVar5 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[1];
  dVar9 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[2];
  dVar10 = (ref_waist_pose->qq).m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  dVar18 = dVar9 * dVar15 - dVar4 * dVar19;
  auVar13._8_4_ = SUB84(dVar18,0);
  auVar13._0_8_ = dVar9 * dVar17 - dVar4 * dVar23;
  auVar13._12_4_ = (int)((ulong)dVar18 >> 0x20);
  dVar22 = SUB168(auVar13 ^ auVar8,0) + dVar5 * dVar19 + dVar10 * dVar15;
  dVar14 = SUB168(auVar13 ^ auVar8,8) + dVar5 * dVar23 + dVar10 * dVar17;
  dVar18 = -(dVar4 * dVar15 + dVar9 * dVar19) + (dVar10 * dVar23 - dVar5 * dVar17);
  dVar10 = dVar4 * dVar17 + dVar9 * dVar23 + (dVar10 * dVar19 - dVar5 * dVar15);
  dVar4 = (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  dVar5 = (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0];
  dVar9 = (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar15 = dVar14 * dVar4 - dVar9 * dVar10;
  dVar4 = dVar10 * dVar5 - dVar4 * dVar22;
  dVar5 = dVar9 * dVar22 - dVar5 * dVar14;
  dVar15 = dVar15 + dVar15;
  dVar4 = dVar4 + dVar4;
  dVar5 = dVar5 + dVar5;
  dVar23 = dVar18 * dVar15 +
           (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0] + (dVar14 * dVar5 - dVar4 * dVar10) +
           (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
  dVar7 = dVar18 * dVar4 +
          (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1] + (dVar10 * dVar15 - dVar5 * dVar22) +
          (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[0] = dVar23;
  (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[1] = dVar7;
  (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[2] = 0.0;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] = dVar22;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = dVar14;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] = dVar10;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = dVar18;
  uVar3 = (ulong)*(uint *)(this + 0x8d8);
  dVar4 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[0];
  dVar5 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[1];
  dVar9 = *(double *)(this + uVar3 * 0x18 + 0x900);
  dVar10 = (ref_waist_pose->qq).m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  dVar18 = (ref_waist_pose->qq).m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  dVar20 = dVar5 * dVar9 - *(double *)(this + uVar3 * 0x18 + 0x8f8) * dVar10;
  dVar12 = dVar4 * *(double *)(this + uVar3 * 0x18 + 0x8f8) -
           *(double *)(this + uVar3 * 0x18 + 0x8f0) * dVar5;
  dVar12 = dVar12 + dVar12;
  dVar25 = dVar10 * *(double *)(this + uVar3 * 0x18 + 0x8f0) - dVar9 * dVar4;
  dVar20 = dVar20 + dVar20;
  dVar25 = dVar25 + dVar25;
  dVar22 = *(double *)(this + uVar3 * 0x18 + 0x8f0 + 8);
  dVar14 = *(double *)(this + 0x940);
  dVar15 = *(double *)(this + 0x948);
  dVar17 = *(double *)(this + 0x950);
  dVar19 = *(double *)(this + 0x958);
  dVar24 = dVar10 * dVar14 - dVar4 * dVar17;
  auVar11._8_4_ = SUB84(dVar24,0);
  auVar11._0_8_ = dVar10 * dVar15 - dVar4 * dVar19;
  auVar11._12_4_ = (int)((ulong)dVar24 >> 0x20);
  dVar24 = dVar4 * dVar14 + dVar10 * dVar17;
  auVar6._8_4_ = SUB84(dVar24,0);
  auVar6._0_8_ = dVar4 * dVar15 + dVar10 * dVar19;
  auVar6._12_4_ = (int)((ulong)dVar24 >> 0x20);
  ref_land_pose[uVar3].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] =
       dVar20 * dVar18 + *(double *)(this + uVar3 * 0x18 + 0x8f0) +
       (dVar5 * dVar12 - dVar25 * dVar10) + dVar23;
  ref_land_pose[uVar3].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = dVar25 * dVar18 + dVar22 + (dVar10 * dVar20 - dVar12 * dVar4) + dVar7;
  ref_land_pose[uVar3].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = dVar12 * dVar18 + dVar9 + (dVar4 * dVar25 - dVar20 * dVar5) + 0.0;
  ref_land_pose[uVar3].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] = SUB168(auVar11 ^ auVar8,0) + dVar5 * dVar17 + dVar14 * dVar18;
  ref_land_pose[uVar3].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = SUB168(auVar11 ^ auVar8,8) + dVar5 * dVar19 + dVar15 * dVar18;
  pdVar1 = ref_land_pose[uVar3].qq.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array + 2;
  *pdVar1 = SUB168(auVar6 ^ auVar2,0) + (dVar18 * dVar17 - dVar5 * dVar14);
  pdVar1[1] = SUB168(auVar6 ^ auVar2,8) + (dVar18 * dVar19 - dVar5 * dVar15);
  return;
}

Assistant:

void cpgen::calcNextFootprint(const Vector3& step_vector, double step_angle,
    Pose& ref_waist_pose, Pose ref_land_pose[]) {

  // calc next waist pose
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);

  // calc footprints
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
}